

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambdaref_expression.cpp
# Opt level: O2

bool __thiscall duckdb::LambdaRefExpression::IsScalar(LambdaRefExpression *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "lambda reference expressions are transient, IsScalar should never be called",&local_39
            );
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool LambdaRefExpression::IsScalar() const {
	throw InternalException("lambda reference expressions are transient, IsScalar should never be called");
}